

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cpp
# Opt level: O3

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* __thiscall
Graph::Gotlieb(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *__return_storage_ptr__,Graph *this,int r,int *m,
              vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              *adjMatrix)

{
  int *piVar1;
  ulong *puVar2;
  _Bit_type *p_Var3;
  _Bit_type _Var4;
  ulong uVar5;
  pointer pvVar6;
  long lVar7;
  bool bVar8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar9;
  int iVar10;
  ostream *poVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  size_type sVar15;
  bool bVar16;
  long *plVar17;
  ulong uVar18;
  _Bit_type *p_Var19;
  ulong uVar20;
  int n;
  int iVar21;
  ulong uVar22;
  pointer pvVar23;
  uint uVar24;
  long lVar25;
  int iVar26;
  ulong uVar27;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  copytreeAdjMat;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  dmat;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  treeAdjMat;
  vector<int,_std::allocator<int>_> x;
  allocator_type local_f1;
  ulong local_f0;
  ulong local_e8;
  allocator_type local_d9;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_d8;
  pointer local_d0;
  size_type local_c8;
  vector<int,_std::allocator<int>_> local_c0;
  vector<int,_std::allocator<int>_> local_a8;
  int *local_90;
  ulong local_88;
  vector<int,_std::allocator<int>_> local_80;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_68;
  Graph *local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  uVar27 = (ulong)(uint)r;
  *m = 0;
  sVar15 = (size_type)r;
  local_68.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  local_d0 = (pointer)adjMatrix;
  local_90 = m;
  local_50 = this;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,sVar15,(value_type_conflict *)&local_68,(allocator_type *)&local_c0);
  std::vector<int,_std::allocator<int>_>::vector(&local_c0,sVar15,(allocator_type *)&local_a8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_68,sVar15,&local_c0,(allocator_type *)&local_80);
  if (local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_a8,sVar15,(allocator_type *)&local_80);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_c0,sVar15,&local_a8,&local_f1);
  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (0 < r) {
    p_Var3 = (local_d0->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
             ._M_start.super__Bit_iterator_base._M_p;
    lVar12 = 0;
    uVar14 = 0;
    do {
      _Var4 = p_Var3[uVar14 * 5];
      plVar17 = (long *)(CONCAT44(local_68.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                  local_68.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar12);
      bVar16 = false;
      uVar20 = uVar14;
      do {
        if (!bVar16 &&
            (*(ulong *)(_Var4 + (uVar20 >> 6 & 0x3ffffff) * 8) >> (uVar20 & 0x3f) & 1) != 0) {
          bVar16 = true;
          *(undefined4 *)
           (*(long *)(CONCAT44(local_68.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                               local_68.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_4_) + uVar14 * 0x18) +
           uVar20 * 4) = 1;
          *(undefined4 *)(*plVar17 + uVar14 * 4) = 1;
        }
        uVar20 = uVar20 + 1;
        plVar17 = plVar17 + 3;
      } while (uVar27 != uVar20);
      uVar14 = uVar14 + 1;
      lVar12 = lVar12 + 0x18;
    } while (uVar14 != uVar27);
    if (0 < r) {
      uVar14 = 0;
      do {
        lVar12 = *(long *)(CONCAT44(local_68.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    local_68.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_4_) + uVar14 * 0x18
                          );
        lVar25 = *(long *)(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + uVar14 * 6);
        uVar20 = 0;
        do {
          *(undefined4 *)(lVar25 + uVar20 * 4) = *(undefined4 *)(lVar12 + uVar20 * 4);
          uVar20 = uVar20 + 1;
        } while (uVar27 != uVar20);
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar27);
    }
  }
  local_c8 = sVar15;
  poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,r);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
  if (0 < r) {
    uVar14 = 0;
    do {
      lVar12 = *(long *)(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar14 * 6);
      uVar20 = 0;
      do {
        if (*(int *)(lVar12 + uVar20 * 4) == 1) {
          lVar25 = *(long *)(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + uVar20 * 6);
          uVar18 = 0;
          do {
            if (*(int *)(lVar25 + uVar18 * 4) == 1) {
              *(undefined4 *)(lVar12 + uVar18 * 4) = 1;
              piVar1 = (int *)(lVar25 + uVar18 * 4);
              *piVar1 = -*piVar1;
            }
            uVar18 = uVar18 + 1;
          } while (uVar27 != uVar18);
          poVar11 = (ostream *)(ulong)(uint)r;
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 != uVar27);
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar27);
    if (0 < r) {
      uVar14 = 0;
      do {
        uVar20 = 0;
        bVar16 = false;
        do {
          lVar12 = *(long *)(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + uVar20 * 6);
          if (*(int *)(lVar12 + uVar14 * 4) == 1) {
            if (bVar16) {
              uVar18 = 0;
              do {
                if (*(int *)(lVar12 + uVar18 * 4) == 1) {
                  *(undefined4 *)
                   (*(long *)(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + (long)(int)poVar11 * 6) +
                   uVar18 * 4) = 1;
                  piVar1 = (int *)(lVar12 + uVar18 * 4);
                  *piVar1 = -*piVar1;
                }
                uVar18 = uVar18 + 1;
              } while (uVar27 != uVar18);
            }
            else {
              bVar16 = true;
              poVar11 = (ostream *)(uVar20 & 0xffffffff);
            }
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar27);
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar27);
      if (0 < r) {
        uVar14 = 0;
        local_f0 = 0;
        do {
          uVar20 = 0;
          do {
            if (*(int *)(*(long *)(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + uVar14 * 6) + uVar20 * 4) == 1
               ) {
              local_f0 = (ulong)((int)local_f0 + 1);
              break;
            }
            uVar20 = uVar20 + 1;
          } while (uVar27 != uVar20);
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar27);
        goto LAB_00103119;
      }
    }
  }
  local_f0 = 0;
LAB_00103119:
  std::vector<int,_std::allocator<int>_>::vector(&local_80,sVar15,(allocator_type *)&local_f1);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_a8,(long)(int)local_f0,&local_80,&local_d9);
  local_d8 = __return_storage_ptr__;
  if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_88 = local_f0 & 0xffffffff;
  local_e8 = uVar27;
  if (r < 1) {
LAB_00103230:
    piVar1 = local_90;
    sVar15 = local_c8;
    if (0 < (int)local_f0) {
      uVar14 = 0;
      bVar16 = false;
      do {
        if (0 < (int)local_e8) {
          lVar12 = *(long *)(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + uVar14 * 6);
          p_Var3 = (local_d0->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          uVar20 = 0;
          do {
            if (*(int *)(lVar12 + uVar20 * 4) == 1) {
              uVar22 = 1L << ((byte)uVar20 & 0x3f);
              uVar18 = 0;
              p_Var19 = p_Var3;
              do {
                uVar5 = *(ulong *)(*p_Var19 + (uVar20 >> 6) * 8);
                if ((((uVar5 & uVar22) != 0) && (*(int *)(lVar12 + uVar18 * 4) == 0)) &&
                   (bVar8 = !bVar16, bVar16 = true, bVar8)) {
                  *(ulong *)(*p_Var19 + (uVar20 >> 6) * 8) = uVar5 | uVar22;
                  puVar2 = (ulong *)(p_Var3[uVar20 * 5] + (uVar18 >> 6 & 0x3ffffff) * 8);
                  *puVar2 = *puVar2 | 1L << ((byte)uVar18 & 0x3f);
                }
                uVar18 = uVar18 + 1;
                p_Var19 = p_Var19 + 5;
              } while (uVar27 != uVar18);
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 != uVar27);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != local_88);
    }
    if ((int)local_e8 < 1) {
      iVar10 = *local_90;
    }
    else {
      lVar25 = 8;
      lVar12 = 0;
      do {
        lVar7 = CONCAT44(local_68.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         local_68.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_4_);
        if (*(long *)(lVar7 + lVar25) - *(long *)(lVar7 + -8 + lVar25) >> 2 != sVar15) {
          __assert_fail("static_cast<size_t>(r)==treeAdjMat_i.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/leannejdong[P]circuitdebug/algorithm.cpp"
                        ,200,
                        "vector<vector<int>> Graph::Gotlieb(int, int *, vector<vector<bool>> &)");
        }
        iVar10 = countDifference<std::vector<int,std::allocator<int>>,std::vector<bool,std::allocator<bool>>>
                           (local_50,(vector<int,_std::allocator<int>_> *)(lVar7 + lVar25 + -8),
                            (vector<bool,_std::allocator<bool>_> *)
                            ((long)(local_d0->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                            lVar12));
        iVar10 = iVar10 + *piVar1;
        *piVar1 = iVar10;
        lVar25 = lVar25 + 0x18;
        lVar12 = lVar12 + 0x28;
      } while (uVar27 * 0x28 != lVar12);
    }
    *piVar1 = iVar10 / 2;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector(local_d8,sVar15,(allocator_type *)&local_80);
    iVar26 = (int)local_e8 + 1;
    uVar24 = (iVar10 / 2) * iVar26;
    local_f0 = (ulong)uVar24;
    iVar10 = uVar24 + 1;
    if (0 < (int)local_e8) {
      lVar12 = 0;
      do {
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&(((local_d8->
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data + lVar12),(long)iVar10);
        lVar12 = lVar12 + 0x18;
      } while (uVar27 * 0x18 != lVar12);
    }
    pvVar9 = local_d8;
    if ((int)local_e8 < iVar10) {
      pvVar6 = (local_d8->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      iVar13 = 0;
      do {
        if (0 < (int)local_e8) {
          lVar12 = 0;
          do {
            *(undefined4 *)
             (*(long *)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data + lVar12) + (long)iVar13 * 4) = 0xfffffffc;
            lVar12 = lVar12 + 0x18;
          } while (uVar27 * 0x18 != lVar12);
        }
        iVar13 = iVar13 + iVar26;
      } while (iVar13 < iVar10 - (int)local_e8);
    }
    iVar10 = (int)local_f0;
    if (0 < (int)local_e8) {
      pvVar6 = (local_d8->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar12 = 0;
      do {
        *(undefined4 *)
         (*(long *)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data + lVar12) + (long)iVar10 * 4) = 0xfffffffb;
        lVar12 = lVar12 + 0x18;
      } while (uVar27 * 0x18 != lVar12);
    }
    if (0 < iVar10) {
      iVar13 = 1;
      do {
        if (0 < (int)local_e8) {
          pvVar6 = (local_d8->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar14 = 0;
          do {
            lVar12 = *(long *)(CONCAT44(local_68.
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                        local_68.
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                              uVar14 * 0x18);
            lVar25 = *(long *)&pvVar6[uVar14].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data;
            uVar20 = 0;
            do {
              *(undefined4 *)(lVar25 + (long)iVar13 * 4 + uVar20 * 4) =
                   *(undefined4 *)(lVar12 + uVar20 * 4);
              uVar20 = uVar20 + 1;
            } while (uVar27 != uVar20);
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar27);
        }
        iVar13 = iVar13 + iVar26;
      } while (iVar13 <= iVar10);
    }
    if (0 < (int)local_e8) {
      local_d0 = (pointer)(local_d0->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      uVar20 = 1;
      lVar12 = 0x18;
      iVar13 = 1;
      uVar14 = 0;
      do {
        uVar18 = uVar14 + 1;
        if ((long)uVar18 < (long)local_c8) {
          lVar25 = *(long *)&local_d0[uVar14].super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data;
          pvVar6 = (local_d8->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          plVar17 = (long *)((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data + lVar12);
          uVar22 = uVar20;
          do {
            if (((*(ulong *)(lVar25 + (uVar22 >> 6 & 0x3ffffff) * 8) >> (uVar22 & 0x3f) & 1) != 0)
               && (*(int *)(*(long *)(CONCAT44(local_68.
                                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               local_68.
                                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                     uVar14 * 0x18) + uVar22 * 4) == 0)) {
              *(undefined4 *)
               (*(long *)&pvVar6[uVar14].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data + (long)((int)uVar22 + iVar13) * 4) = 1;
              *(undefined4 *)(*plVar17 + (long)(iVar13 + (int)uVar14) * 4) = 1;
              iVar13 = iVar13 + iVar26;
            }
            uVar22 = uVar22 + 1;
            plVar17 = plVar17 + 3;
          } while (uVar27 != uVar22);
        }
        uVar20 = uVar20 + 1;
        lVar12 = lVar12 + 0x18;
        uVar14 = uVar18;
      } while (uVar18 != uVar27);
    }
    if (0 < iVar10) {
      iVar13 = 1;
      do {
        if (0 < (int)local_e8) {
          do {
            pvVar6 = (local_d8->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            bVar16 = true;
            uVar14 = 0;
            do {
              lVar12 = *(long *)&pvVar6[uVar14].super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl + (long)iVar13 * 4;
              uVar20 = 0;
              iVar21 = 0;
              do {
                iVar21 = iVar21 + (uint)(*(int *)(lVar12 + uVar20 * 4) == 1);
                uVar20 = uVar20 + 1;
              } while (uVar27 != uVar20);
              if (iVar21 == 1) {
                uVar20 = 0;
                pvVar23 = pvVar6;
                do {
                  if (*(int *)(lVar12 + uVar20 * 4) == 1) {
                    bVar16 = false;
                    *(undefined4 *)(lVar12 + uVar20 * 4) = 0;
                    *(undefined4 *)
                     (*(long *)&(pvVar23->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data + uVar14 * 4 + (long)iVar13 * 4) = 0;
                  }
                  uVar20 = uVar20 + 1;
                  pvVar23 = pvVar23 + 1;
                } while (uVar27 != uVar20);
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar27);
          } while ((!bVar16) && (0 < (int)local_e8));
        }
        iVar13 = iVar13 + iVar26;
      } while (iVar13 <= iVar10);
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&local_a8);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&local_c0);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_68);
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return pvVar9;
  }
  uVar14 = 0;
  iVar10 = 0;
  do {
    lVar12 = *(long *)(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar14 * 6);
    uVar20 = 0;
    while (*(int *)(lVar12 + uVar20 * 4) != 1) {
      uVar20 = uVar20 + 1;
      if (uVar27 == uVar20) goto LAB_001031c9;
    }
    lVar25 = *(long *)(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + (long)iVar10 * 6);
    uVar20 = 0;
    do {
      *(undefined4 *)(lVar25 + uVar20 * 4) = *(undefined4 *)(lVar12 + uVar20 * 4);
      uVar20 = uVar20 + 1;
    } while (uVar27 != uVar20);
    iVar10 = iVar10 + 1;
LAB_001031c9:
    uVar14 = uVar14 + 1;
    if (uVar14 == uVar27) {
      if (0 < r) {
        iVar10 = (int)local_f0;
        lVar12 = local_88 * 0x18;
        uVar14 = 0;
        do {
          if (0 < (int)local_f0) {
            lVar25 = 0;
            do {
              if ((*(int *)(*(long *)((long)local_a8.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start + lVar25) +
                           uVar14 * 4) == 0) && (uVar14 == iVar10 - 1)) {
                puts("\nError in block 2 while searching for independent meshes");
              }
              lVar25 = lVar25 + 0x18;
            } while (lVar12 != lVar25);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar27);
      }
      goto LAB_00103230;
    }
  } while( true );
}

Assistant:

vector<vector<int>> Gotlieb(int r, int *m, vector<vector<bool>>& adjMatrix)
    {
        *m = 0; int i, j, k, c, nu, done, f, n;
        vector<int> x(r, 0);
        //Block 1
        vector<vector<int>> treeAdjMat(r, vector<int>(r));
        vector<vector<int>> copytreeAdjMat(r, vector<int>(r));
        for (i=0; i < r; i++)
        {
            done = 0;
            for (j=i; j < r; j++)
            {
                if(adjMatrix[i][j]==1 && done==0){
                    treeAdjMat[i][j]=1;
                    treeAdjMat[j][i]=1;
                    done=1;
                }
            }
        }
        //Block 2
        for(i=0; i<r; i++)
        {
            for(j=0; j<r; j++)
            {
                assert(i < r);
                copytreeAdjMat[i][j]=treeAdjMat[i][j];
            }
        }
        cout << r << "\n";

        for(i=0; i<r; i++)
        {
            for(j=0; j<r; j++)
            {
                if(copytreeAdjMat[i][j]==1)
                {
                    for(k=0; k<r; k++)
                        if(copytreeAdjMat[j][k]==1){
                            copytreeAdjMat[i][k]=copytreeAdjMat[j][k];
                            copytreeAdjMat[j][k]=-copytreeAdjMat[j][k];
                        }
                }
            }
        }

        // now join together the strands that are part of a single cord
        for(j=0; j<r; j++){
            bool found = false;
            for(i=0; i<r; i++)
            {
                if(copytreeAdjMat[i][j]==1 && !found)
                {
                    k=i;
                    found=true;
                }
                else if(copytreeAdjMat[i][j]==1 && found){
                    for(int n=0; n<r; n++)
                        if(copytreeAdjMat[i][n]==1)
                        {
                            copytreeAdjMat[k][n]=copytreeAdjMat[i][n];
                            copytreeAdjMat[i][n]=-copytreeAdjMat[i][n];
                        }
                }
            }
        }

        //count how many lines the matrix c has
        n=0;
        for(i=0;i<r; i++)
        {
            for(j=0;j<r; j++)
            {
                if(copytreeAdjMat[i][j]==1){
                    n++;
                    break;
                }
            }
        }

        vector<vector<int>> dmat(n, vector<int>(r));

        k=0;
        for(i=0; i<r; i++)
        {
            for(j=0; j<r; j++)
            {
                if(copytreeAdjMat[i][j]==1)
                {
                    for(f=0; f<r; f++)
                    {
                        dmat[k][f]=copytreeAdjMat[i][f];
                    }
                    k++;
                    break;
                }

            }
        }

        //correctness check
        for(j=0; j<r; j++)
        {
            for(i=0; i<n; i++)
            {
                assert(i<n);
                if(dmat[i][j]==1)
                {
                    continue;
                }
                if(dmat[i][j]==0 && j==n-1)
                {
                    printf("\nError in block 2 while searching for independent meshes\n");
                }
            }
        }

        // So far, we have constructed a spanning tree. Now let focus on finding cycle bases
        /*BLOCK 3*/
        f=0;
        for(i=0;i<n; i++)
            for(j=0;j<r; j++)
                if(dmat[i][j]==1)
                    for(k=0; k<r; k++) /*I'm going to see if I find a side that joins the cords in the j-th column of a*/
                        if(adjMatrix[k][j]==1 && dmat[i][k]==0 && f==0) {
                            /*printf("k=%d\tj=%d\n", k, j);*/
                            adjMatrix[k][j]=1;
                            adjMatrix[j][k]=1;
                            f=1;       /*I have to add only one side!*/
                        }

        for(i=0; i<r; i++)
        {
            vector<int> &treeAdjMat_i = treeAdjMat[i];
            vector<bool> &adjMatrix_i = adjMatrix[i];

            //int n_differences = 0;
            assert(static_cast<size_t>(r)==treeAdjMat_i.size());
            *m += countDifference(treeAdjMat_i,adjMatrix_i);
        }
        int &count = *m;
        count /= 2;
        //count how many sides have to be eliminated to obtain the tree graph = number of independent links
        c = r*count + count + 1;
        vector<vector<int>> indm(r);
        for (int i = 0; i<r; ++i)
        {
            indm[i].resize(c);
        }

        for (j = 0; j < c-r; j = j+r+1)
            for (i = 0; i < r; i++)
                indm[i][j] = -4;
        for (i = 0; i < r; i++)
            indm[i][c-1]=-5;
        for (k = 1; k < c; k=k+r+1)
            for(i = 0; i < r; i++)
                for(j = 0; j < r; j++)
                    indm[i][j+k] = treeAdjMat[i][j];
        // add the sides at a time
        k = 1;
        for(i = 0; i < r; i++)
            for(j = i+1; j<r; j++)
                if(adjMatrix[i][j]==1 && treeAdjMat[i][j]==0)
                {
                    indm[i][j+k]=1;
                    indm[j][i+k]=1;
                    k = k + r + 1;
                }
        /*I remove the segments that are outside the loop (see drawing)*/
        nu = 0; /*nu is the number one on a line*/
        done=0;
        for(k=1; k<c; k=k+r+1){
            while(done==0){
                done=1;
                for(i=0; i<r; i++){
                    for(j=0; j<r; j++)
                    {
                        /*Count how many ones are on a line*/
                        if(indm[i][j+k]==1)
                        {
                            nu++;
                        }
                    }
                    if(nu==1)
                    {
                        /*if there is only one,  make it null*/
                        for(j=0; j<r; j++)    /*I am in the j of 1*/
                        {
                            if(indm[i][j+k]==1){
                                indm[i][j+k]=0;
                                indm[j][i+k]=0;
                                done=0;
                            }
                        }
                    }
                    nu=0;
                }
            }
            done=0;
        }
        return indm;
    }